

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solve.c
# Opt level: O2

void solvhandler(void)

{
  short sVar1;
  int neq;
  Item *pIVar2;
  Item *pIVar3;
  Symbol *fun;
  List *pLVar4;
  int iVar5;
  int iVar6;
  Item *pIVar7;
  Symbol *pSVar8;
  long lVar9;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  int extraout_EDX_03;
  int extraout_EDX_04;
  int ss;
  int ss_00;
  int extraout_EDX_05;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar10;
  undefined8 extraout_RDX_02;
  char *pcVar11;
  short sVar12;
  uint local_54;
  long local_50;
  List *errstmt;
  List *local_38;
  
  if (solvq == (List *)0x0) {
    solvq = newlist();
  }
  init_disc_vars();
  local_38 = solvq;
  uVar10 = extraout_RDX;
  do {
    pLVar4 = solvq;
    iVar5 = (int)uVar10;
    pIVar2 = local_38->next;
    if (pIVar2 == solvq) {
      return;
    }
    sVar1 = pIVar2->itemtype;
    local_50 = 0;
    local_54 = 0;
    sVar12 = sVar1;
    if (sVar1 < 0) {
      sVar12 = -sVar1;
      pIVar2->itemtype = sVar12;
      pIVar7 = pLVar4;
      while( true ) {
        iVar5 = (int)uVar10;
        pIVar7 = pIVar7->next;
        if (pIVar7 == pLVar4) break;
        pIVar3 = (Item *)((pIVar7->element).sym)->subtype;
        if (pIVar3 == (pIVar2->element).itm) {
          pSVar8 = (pIVar7->next->element).sym;
          if (pIVar7->itemtype == 0x400) {
            pcVar11 = 
            "STEADYSTATE requires all SOLVE\'s of this KINETIC block to use the\nsame method (`advance\' or `sparse\'). :"
            ;
            if ((Symbol *)(pIVar2->next->element).itm != pSVar8) goto LAB_0010b558;
            if (pSVar8 == (Symbol *)0x0) goto LAB_0010b56a;
            iVar5 = strcmp("sparse",pSVar8->name);
            pcVar11 = 
            "STEADYSTATE requires all SOLVE\'s of this KINETIC block to use the\nsame method (`advance\' or `sparse\'). :"
            ;
            uVar10 = extraout_RDX_01;
          }
          else {
            pcVar11 = "STEADYSTATE only valid for SOLVEing a KINETIC or DERIVATIVE block:";
            if ((pIVar7->itemtype != 0x200) ||
               (pcVar11 = 
                "STEADYSTATE requires all SOLVE\'s of this DERIVATIVE block to use the\n`derivimplicit\' method:"
               , pSVar8 == (Symbol *)0x0)) goto LAB_0010b558;
            iVar5 = strcmp("derivimplicit",pSVar8->name);
            pcVar11 = 
            "STEADYSTATE requires all SOLVE\'s of this DERIVATIVE block to use the\n`derivimplicit\' method:"
            ;
            uVar10 = extraout_RDX_00;
          }
          if (iVar5 != 0) {
LAB_0010b558:
            diag(pcVar11,pIVar3[2].element.str);
          }
        }
LAB_0010b56a:
        pIVar7 = pIVar7->next->next;
      }
      local_54 = 1;
    }
    pIVar7 = (pIVar2->element).itm;
    pIVar2 = pIVar2->next;
    pSVar8 = (pIVar2->element).sym;
    if (pSVar8 == (Symbol *)0x0) {
      pSVar8 = (Symbol *)0x0;
    }
    else {
      pcVar11 = pSVar8->name;
      iVar6 = strcmp(pcVar11,"after_cvode");
      lVar9 = 1;
      iVar5 = extraout_EDX;
      if (iVar6 != 0) {
        iVar6 = strcmp(pcVar11,"cvode_t");
        lVar9 = 2;
        iVar5 = extraout_EDX_00;
        if (iVar6 != 0) {
          iVar6 = strcmp(pcVar11,"cvode_v");
          lVar9 = 3;
          iVar5 = extraout_EDX_01;
          if (iVar6 != 0) goto LAB_0010b5e9;
        }
      }
      (pIVar2->element).itm = (Item *)0x0;
      pSVar8 = (Symbol *)0x0;
      local_50 = lVar9;
    }
LAB_0010b5e9:
    local_38 = pIVar2->next;
    errstmt = (local_38->element).lst;
    fun = (pIVar7->element).sym;
    pIVar2 = pIVar7->next;
    iVar6 = (fun->u).i;
    neq = fun->used;
    if ((pSVar8 != (Symbol *)0x0) && ((pSVar8->subtype & fun->subtype) == 0)) {
      sprintf(buf,"Method %s can\'t be used with Block %s",pSVar8->name,fun->name);
      diag(buf,(char *)0x0);
    }
    lVar9 = fun->subtype;
    if (lVar9 == 0x80) {
      if (sVar12 == 0x130) {
        whileloop((Item *)0x200,0,iVar5);
        (*(code *)(&DAT_00124484 + *(int *)(&DAT_00124484 + local_50 * 4)))();
        return;
      }
      sprintf(buf," %s();\n",fun->name);
      replacstr(pIVar7,buf);
      sprintf(buf,"{ %s(_threadargs_); }\n",fun->name);
      vectorize_substitute(pIVar7,buf);
    }
    else {
      if (lVar9 == 0x200) {
        if (pSVar8 == (Symbol *)0x0) {
          pSVar8 = lookup("adrunge");
          iVar5 = extraout_EDX_03;
        }
        if (sVar12 == 0x130 && -1 < sVar1) {
          pcVar11 = pSVar8->name;
          iVar5 = strcmp(pcVar11,"cnexp");
          if (((iVar5 != 0) && (iVar5 = strcmp(pcVar11,"derivimplicit"), iVar5 != 0)) &&
             (iVar5 = strcmp(pcVar11,"euler"), iVar5 != 0)) {
            fprintf(_stderr,"Notice: %s is not thread safe. Complain to Hines\n",pcVar11);
            vectorize = 0;
            sprintf(buf," %s();\n",fun->name);
            insertstr(pIVar2,buf);
          }
          sens_nonlin_out(pIVar2,fun);
          cvode_interface(fun,iVar6,neq);
          iVar5 = extraout_EDX_04;
        }
        else if (sVar12 != 0x130) goto LAB_0010b87c;
        whileloop((Item *)0x200,(ulong)local_54,iVar5);
      }
      else {
        if (lVar9 != 0x400) {
          if (lVar9 == 0x800) {
            fwrite("Notice: NONLINEAR is not thread safe.\n",0x26,1,_stderr);
            vectorize = 0;
            if (pSVar8 == (Symbol *)0x0) {
              pSVar8 = lookup("newton");
            }
            solv_nonlin(pIVar7,fun,pSVar8,neq,iVar6);
          }
          else if (lVar9 == 0x1000) {
            fwrite("Notice: DISCRETE is not thread safe.\n",0x25,1,_stderr);
            vectorize = 0;
            if (sVar12 == 0x130) {
              whileloop((Item *)0x10f,0,ss);
            }
            sprintf(buf,"0; %s += d%s; %s();\n",indepsym->name,indepsym->name,fun->name);
            replacstr(pIVar7,buf);
          }
          else if (lVar9 == 0x4000) {
            fwrite("Notice: PARTIAL is not thread safe.\n",0x24,1,_stderr);
            vectorize = 0;
            if (sVar12 == 0x130) {
              whileloop((Item *)0x200,0,ss_00);
            }
            solv_partial(pIVar7,fun);
          }
          else {
            if (lVar9 != 0x10000) {
              diag("Illegal or unimplemented SOLVE type: ",fun->name);
            }
            fwrite("Notice: LINEAR is not thread safe.\n",0x23,1,_stderr);
            vectorize = 0;
            if (pSVar8 == (Symbol *)0x0) {
              pSVar8 = lookup("simeq");
            }
            solv_lineq(pIVar7,fun,pSVar8,neq,iVar6);
          }
          goto LAB_0010b93a;
        }
        if (pSVar8 == (Symbol *)0x0) {
          pSVar8 = lookup("_advance");
          iVar5 = extraout_EDX_02;
        }
        if (sVar12 == 0x130) {
          if ((pSVar8->subtype & 0x200) != 0) {
            fwrite("Notice: KINETIC with is thread safe only with METHOD sparse. Complain to Hines\n"
                   ,0x4f,1,_stderr);
            vectorize = 0;
            sprintf(buf," %s();\n",fun->name);
            insertstr(pIVar2,buf);
            sens_nonlin_out(pIVar2,fun);
            iVar5 = extraout_EDX_05;
          }
          whileloop((Item *)0x200,(ulong)local_54,iVar5);
          iVar5 = strcmp(pSVar8->name,"sparse");
          if (iVar5 == 0) {
            cvode_interface(fun,iVar6,neq);
            cvode_kinetic(pIVar7,fun,neq,iVar6);
            single_channel(pIVar7,fun,neq,iVar6);
          }
        }
      }
LAB_0010b87c:
      solv_diffeq(pIVar7,fun,pSVar8,neq,iVar6,local_54,(int)sVar12);
    }
LAB_0010b93a:
    if (sVar12 == 0x130) {
      cvode_valid();
    }
    insertstr(pIVar7,"error =");
    move(errstmt->next,errstmt->prev,pIVar7->next);
    if (errstmt->next == errstmt->prev) {
      vectorize_substitute(pIVar7->next,"");
      vectorize_substitute(pIVar7->prev,"");
    }
    else {
      fwrite("Notice: SOLVE with ERROR is not thread safe.\n",0x2d,1,_stderr);
      vectorize = 0;
    }
    freelist(&errstmt);
    uVar10 = extraout_RDX_02;
  } while( true );
}

Assistant:

void solvhandler()
{
	Item *lq, *qsol, *follow;
	List *errstmt;
	Symbol *fun, *method;
	int numeqn, listnum, btype, steadystate;
	int cvodemethod_;
	
	if (!solvq)
		solvq = newlist();
	init_disc_vars(); /*why not here?*/
	ITERATE(lq, solvq) { /* remember it goes by 3's */
		steadystate=0;
		btype = lq->itemtype;
		if (btype < 0) {
			btype = lq->itemtype = -btype;
			steadystate = 1;
			check_ss_consist(lq);
		}
		qsol = ITM(lq);
		lq = lq->next;
		method = SYM(lq);
#if CVODE
		cvodemethod_ = 0;
		if (method && strcmp(method->name, "after_cvode") == 0) {
			method = (Symbol*)0;
			lq->element.sym = (Symbol*)0;
			cvodemethod_ = 1;
		}
		if (method && strcmp(method->name, "cvode_t") == 0) {
			method = (Symbol*)0;
			lq->element.sym = (Symbol*)0;
			cvodemethod_ = 2;
		}
		if (method && strcmp(method->name, "cvode_v") == 0) {
			method = (Symbol*)0;
			lq->element.sym = (Symbol*)0;
			cvodemethod_ = 3;
		}
#endif	
		lq = lq->next;
		errstmt = LST(lq);
		/* err stmt handling assumes qsol->next is where it goes. */
		fun = SYM(qsol);
		numeqn = fun->used;
		listnum =fun->u.i;
		follow = qsol->next; /* where p[0] gets updated */
		/* Check consistency of method and block type */
		if (method && !(method->subtype & fun->subtype)) {
			Sprintf(buf, "Method %s can't be used with Block %s",
				method->name, fun->name);
			diag(buf, (char *)0);
		}
		
		switch (fun->subtype) {

		case DERF:
			if (method == SYM0) {
				method = lookup("adrunge");
			}
			if (btype == BREAKPOINT && !steadystate) {
				/* derivatives recalculated after while loop */
if (strcmp(method->name, "cnexp") != 0 && strcmp(method->name, "derivimplicit") != 0 && strcmp(method->name, "euler") != 0) {
fprintf(stderr, "Notice: %s is not thread safe. Complain to Hines\n", method->name);
				vectorize = 0;
				Sprintf(buf, " %s();\n", fun->name);
				Insertstr(follow, buf);
		}
				/* envelope calls go after the while loop */
				sens_nonlin_out(follow, fun);
#if CVODE
				cvode_interface(fun, listnum, numeqn);
#endif
			}
			if (btype == BREAKPOINT) whileloop(qsol, (long)DERF, steadystate);
			solv_diffeq(qsol, fun,  method, numeqn, listnum, steadystate, btype);
			break;
		case KINF:
			if (method == SYM0) {
				method = lookup("_advance");
			}
			if (btype == BREAKPOINT && (method->subtype & DERF)) {
#if VECTORIZE
fprintf(stderr, "Notice: KINETIC with is thread safe only with METHOD sparse. Complain to Hines\n");
				vectorize = 0;
#endif
				/* derivatives recalculated after while loop */
				Sprintf(buf, " %s();\n", fun->name);
				Insertstr(follow, buf);
				/* envelope calls go after the while loop */
				sens_nonlin_out(follow, fun);
			}
			if (btype == BREAKPOINT) {
				whileloop(qsol, (long)DERF, steadystate);
#if CVODE
	if (strcmp(method->name, "sparse") == 0) {
				cvode_interface(fun, listnum, numeqn);
				cvode_kinetic(qsol, fun, numeqn, listnum);
				single_channel(qsol, fun, numeqn, listnum);
	}
#endif
			}
			solv_diffeq(qsol, fun,  method, numeqn, listnum, steadystate, btype);
			break;
		case NLINF:
#if VECTORIZE
fprintf(stderr, "Notice: NONLINEAR is not thread safe.\n");
			vectorize = 0;
#endif
			if (method == SYM0) {
				method = lookup("newton");
			}
			solv_nonlin(qsol, fun, method, numeqn, listnum);
			break;
		case LINF:
#if VECTORIZE
fprintf(stderr, "Notice: LINEAR is not thread safe.\n");
			vectorize = 0;
#endif
			if (method == SYM0) {
				method = lookup("simeq");
			}
			solv_lineq(qsol, fun, method, numeqn, listnum);
			break;
		case DISCF:
#if VECTORIZE
fprintf(stderr, "Notice: DISCRETE is not thread safe.\n");
			vectorize = 0;
#endif
			if (btype == BREAKPOINT) whileloop(qsol, (long)DISCRETE, 0);
			Sprintf(buf, "0; %s += d%s; %s();\n",
				indepsym->name, indepsym->name, fun->name);
			replacstr(qsol, buf);
			break;
#if 1	/* really wanted? */
		case PROCED:
			if (btype == BREAKPOINT) {
				whileloop(qsol, (long)DERF, 0);
#if CVODE
	if (cvodemethod_ == 1) { /*after_cvode*/
				cvode_interface(fun, listnum, 0);
	}
	if (cvodemethod_ == 2) { /*cvode_t*/
				cvode_interface(fun, listnum, 0);
				insertstr(qsol, "if (!cvode_active_)");
				cvode_nrn_cur_solve_ = fun;
	}
	if (cvodemethod_ == 3) { /*cvode_t_v*/
				cvode_interface(fun, listnum, 0);
				insertstr(qsol, "if (!cvode_active_)");
				cvode_nrn_current_solve_ = fun;
	}
#endif
			}
			Sprintf(buf, " %s();\n", fun->name);
			replacstr(qsol, buf);
#if VECTORIZE
	Sprintf(buf, "{ %s(_threadargs_); }\n",
		fun->name);
	vectorize_substitute(qsol, buf);
#endif
			break;
#endif
		case PARF:
#if VECTORIZE
fprintf(stderr, "Notice: PARTIAL is not thread safe.\n");
			vectorize = 0;
#endif
			if (btype == BREAKPOINT) whileloop(qsol, (long)DERF, 0);
			solv_partial(qsol, fun);
			break;
		default:
			diag("Illegal or unimplemented SOLVE type: ", fun->name);
			break;
		}
#if CVODE
		if (btype == BREAKPOINT) {
			cvode_valid();
		}
#endif
	/* add the error check */
	Insertstr(qsol, "error =");
	move(errstmt->next, errstmt->prev, qsol->next);
#if VECTORIZE
	if (errstmt->next == errstmt->prev) {
		vectorize_substitute(qsol->next, "");
		vectorize_substitute(qsol->prev, "");
	}else{
fprintf(stderr, "Notice: SOLVE with ERROR is not thread safe.\n");
		vectorize = 0;
	}
#endif
	freelist(&errstmt);
	/* under all circumstances, on return from model,
	 p[0] = current indepvar */
	/* obviously ok if indepvar is original; if it has been changed
	away from time
	then _sav_indep will be reset to starting value of original when
	initmodel is called on every call to model */
#if NMODL
#else
		if (btype == BREAKPOINT) {
#if SIMSYS
			Sprintf(buf, "_sav_indep = %s;\n", indepsym->name);
#else
			Sprintf(buf, "_sav_indep = _p[_indepindex];\n");
#endif
			Insertstr(follow, buf);
		}
#endif
	}
}